

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

void __thiscall
module_level_csv_actions::module2(module_level_csv_actions *this,string *module,int level)

{
  ostream *poVar1;
  
  if (this->module2_start_ == true) {
    this->module2_start_ = false;
  }
  else {
    std::operator<<((ostream *)&std::cout," ");
  }
  std::operator<<((ostream *)&std::cout,(string *)module);
  if (level < 0x3fffffff) {
    poVar1 = std::operator<<((ostream *)&std::cout,"(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,level);
    std::operator<<(poVar1,")");
    return;
  }
  return;
}

Assistant:

void module2( std::string const & module, int level )
    {
        if( module2_start_ )
        {
            module2_start_ = false;
        }
        else
        {
            std::cout << " ";
        }

        std::cout << module;

        if( level < unknown_level )
        {
            std::cout << "(" << level << ")";
        }
    }